

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::prepend_child(xml_node *this,xml_node_type type_)

{
  bool bVar1;
  xml_node_type parent;
  xml_node_struct *p;
  xml_node local_30;
  xml_node n;
  xml_allocator *alloc;
  xml_node_type type__local;
  xml_node *this_local;
  
  parent = type(this);
  bVar1 = impl::anon_unknown_0::allow_insert_child(parent,type_);
  if (bVar1) {
    n._root = (xml_node_struct *)
              impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
    bVar1 = impl::anon_unknown_0::xml_allocator::reserve((xml_allocator *)n._root);
    if (bVar1) {
      p = impl::anon_unknown_0::allocate_node(n._root,type_);
      xml_node(&local_30,p);
      bVar1 = operator!(&local_30);
      if (bVar1) {
        xml_node((xml_node *)&this_local);
      }
      else {
        impl::anon_unknown_0::prepend_node(local_30._root,this->_root);
        if (type_ == node_declaration) {
          set_name(&local_30,"xml");
        }
        this_local = (xml_node *)local_30._root;
      }
    }
    else {
      xml_node((xml_node *)&this_local);
    }
  }
  else {
    xml_node((xml_node *)&this_local);
  }
  return (xml_node)(xml_node_struct *)this_local;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::prepend_child(xml_node_type type_)
	{
		if (!impl::allow_insert_child(type(), type_)) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::prepend_node(n._root, _root);

		if (type_ == node_declaration) n.set_name(PUGIXML_TEXT("xml"));

		return n;
	}